

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pending_query_result.cpp
# Opt level: O3

void __thiscall
duckdb::PendingQueryResult::PendingQueryResult(PendingQueryResult *this,ErrorData *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 local_a8 [128];
  
  local_a8[0] = error->initialized;
  local_a8[1] = error->type;
  local_a8._8_8_ = (error->raw_message)._M_dataplus._M_p;
  paVar1 = &(error->raw_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._8_8_ == paVar1) {
    local_a8._24_8_ = paVar1->_M_allocated_capacity;
    local_a8._32_8_ = *(undefined8 *)((long)&(error->raw_message).field_2 + 8);
    local_a8._8_8_ = local_a8 + 0x18;
  }
  else {
    local_a8._24_8_ = paVar1->_M_allocated_capacity;
  }
  local_a8._16_8_ = (error->raw_message)._M_string_length;
  (error->raw_message)._M_dataplus._M_p = (pointer)paVar1;
  (error->raw_message)._M_string_length = 0;
  (error->raw_message).field_2._M_local_buf[0] = '\0';
  local_a8._40_8_ = (error->final_message)._M_dataplus._M_p;
  paVar1 = &(error->final_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._40_8_ == paVar1) {
    local_a8._56_8_ = paVar1->_M_allocated_capacity;
    local_a8._64_8_ = *(undefined8 *)((long)&(error->final_message).field_2 + 8);
    local_a8._40_8_ = local_a8 + 0x38;
  }
  else {
    local_a8._56_8_ = paVar1->_M_allocated_capacity;
  }
  local_a8._48_8_ = (error->final_message)._M_string_length;
  (error->final_message)._M_dataplus._M_p = (pointer)paVar1;
  (error->final_message)._M_string_length = 0;
  (error->final_message).field_2._M_local_buf[0] = '\0';
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)(local_a8 + 0x48),&error->extra_info,&error->extra_info);
  BaseQueryResult::BaseQueryResult
            (&this->super_BaseQueryResult,PENDING_RESULT,(ErrorData *)local_a8);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_a8 + 0x48));
  if ((undefined1 *)local_a8._40_8_ != local_a8 + 0x38) {
    operator_delete((void *)local_a8._40_8_);
  }
  if ((undefined1 *)local_a8._8_8_ != local_a8 + 0x18) {
    operator_delete((void *)local_a8._8_8_);
  }
  (this->super_BaseQueryResult)._vptr_BaseQueryResult =
       (_func_int **)&PTR__PendingQueryResult_02442690;
  (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

PendingQueryResult::PendingQueryResult(ErrorData error)
    : BaseQueryResult(QueryResultType::PENDING_RESULT, std::move(error)) {
}